

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  byte bVar1;
  xmlChar xVar2;
  xmlParserErrors error;
  bool bVar3;
  byte *pbVar4;
  uint uVar5;
  xmlParserInputPtr pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlEntityPtr pxVar10;
  unsigned_long uVar11;
  byte *pbVar12;
  xmlChar *pxVar13;
  byte bVar14;
  xmlParserInputState xVar15;
  ulong uVar16;
  long lVar17;
  char *msg;
  xmlChar xVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  byte *pbVar22;
  byte *pbVar23;
  int *piVar24;
  byte *pbVar25;
  int iVar26;
  long lVar27;
  byte *local_58;
  int local_4c;
  byte *local_48;
  int *local_40;
  unsigned_long local_38;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar6 = ctxt->input;
  pbVar25 = pxVar6->cur;
  iVar19 = pxVar6->line;
  if ((*pbVar25 == 0x22) || (*pbVar25 == 0x27)) {
    iVar26 = pxVar6->col;
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
    pbVar22 = pbVar25 + 1;
    bVar1 = *pbVar25;
    pbVar12 = pxVar6->end;
    local_40 = len;
    if (pbVar22 < pbVar12) {
      xVar15 = XML_PARSER_ATTRIBUTE_VALUE;
    }
    else {
      pxVar7 = pxVar6->base;
      xVar15 = XML_PARSER_ATTRIBUTE_VALUE;
      if (((long)pbVar12 - (long)pbVar25 < 0xfa) && (ctxt->progressive == 0)) {
        xmlGROW(ctxt);
        xVar15 = ctxt->instate;
        if (xVar15 == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
      }
      pxVar6 = ctxt->input;
      pbVar12 = pxVar6->end;
      lVar21 = (long)pxVar6->base - (long)pxVar7;
      lVar27 = 0;
      if (lVar21 != 0) {
        lVar27 = lVar21;
      }
      pbVar22 = pbVar22 + lVar27;
    }
    iVar26 = iVar26 + 1;
    pbVar25 = pbVar22;
    if (normalize == 0) {
      do {
        lVar27 = (long)pbVar25 - (long)pbVar22;
        do {
          if ((((pbVar12 <= pbVar25) || (bVar14 = *pbVar25, (char)bVar14 < ' ' || bVar14 == bVar1))
              || (bVar14 == 0x26)) || (bVar14 == 0x3c)) {
            if ((10000000 < lVar27) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015aaab;
            bVar14 = *pbVar25;
            pbVar23 = pbVar22;
            pbVar22 = pbVar25;
            piVar24 = local_40;
            goto joined_r0x0015aabc;
          }
          pbVar25 = pbVar25 + 1;
          iVar26 = iVar26 + 1;
          lVar27 = lVar27 + 1;
        } while (pbVar25 < pbVar12);
        pxVar7 = pxVar6->base;
        if ((ctxt->progressive == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
          xmlGROW(ctxt);
          xVar15 = ctxt->instate;
        }
        if (xVar15 == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        pxVar6 = ctxt->input;
        lVar17 = (long)pxVar6->base - (long)pxVar7;
        lVar21 = 0;
        if (lVar17 != 0) {
          lVar21 = lVar17;
        }
        pbVar12 = pxVar6->end;
        pbVar22 = pbVar22 + lVar21;
        pbVar25 = pbVar25 + lVar21;
      } while ((lVar27 < 0x989681) || ((ctxt->options & 0x80000) != 0));
    }
    else {
      while ((pbVar23 = pbVar22, pbVar22 < pbVar12 &&
             (((*pbVar22 != bVar1 && (uVar5 = (uint)*pbVar22, uVar5 < 0x21)) &&
              ((0x100002600U >> ((ulong)uVar5 & 0x3f) & 1) != 0))))) {
        iVar26 = iVar26 + 1;
        if (uVar5 == 10) {
          iVar26 = 1;
        }
        iVar19 = iVar19 + (uint)(uVar5 == 10);
        pbVar22 = pbVar22 + 1;
        if (pbVar12 <= pbVar22) {
          pxVar7 = pxVar6->base;
          if ((ctxt->progressive == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
            xmlGROW(ctxt);
            xVar15 = ctxt->instate;
          }
          if (xVar15 == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
          pxVar6 = ctxt->input;
          pbVar12 = pxVar6->end;
          lVar21 = (long)pxVar6->base - (long)pxVar7;
          lVar27 = 0;
          if (lVar21 != 0) {
            lVar27 = lVar21;
          }
          pbVar22 = pbVar22 + lVar27;
        }
      }
      do {
        lVar27 = (long)pbVar22 - (long)pbVar23;
        do {
          pbVar4 = pbVar22;
          if (((pbVar12 <= pbVar22) || (bVar14 = *pbVar22, (char)bVar14 < ' ' || bVar14 == bVar1))
             || ((bVar14 == 0x26 || (bVar14 == 0x3c)))) goto LAB_0015a846;
          pbVar22 = pbVar22 + 1;
          if ((bVar14 == 0x20) && (*pbVar22 == 0x20)) {
            iVar26 = iVar26 + 1;
            pbVar4 = pbVar22;
            goto LAB_0015a846;
          }
          lVar27 = lVar27 + 1;
          iVar26 = iVar26 + 1;
        } while (pbVar22 < pbVar12);
        pxVar7 = pxVar6->base;
        if ((ctxt->progressive == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
          xmlGROW(ctxt);
          xVar15 = ctxt->instate;
        }
        if (xVar15 == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        pxVar6 = ctxt->input;
        lVar17 = (long)pxVar6->base - (long)pxVar7;
        lVar21 = 0;
        if (lVar17 != 0) {
          lVar21 = lVar17;
        }
        pbVar12 = pxVar6->end;
        pbVar23 = pbVar23 + lVar21;
        pbVar22 = pbVar22 + lVar21;
      } while ((lVar27 < 0x989681) || ((ctxt->options & 0x80000) != 0));
    }
LAB_0015aaab:
    xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
  }
  else {
LAB_0015b1cb:
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
code_r0x0015a88b:
  iVar26 = iVar26 + 1;
  if (uVar5 == 10) {
    iVar26 = 1;
  }
  iVar19 = iVar19 + (uint)(uVar5 == 10);
  pbVar22 = pbVar22 + 1;
  lVar27 = lVar27 + 1;
  if (pbVar12 <= pbVar22) goto code_r0x0015a8a8;
  goto LAB_0015a861;
code_r0x0015a8a8:
  pxVar7 = pxVar6->base;
  if ((ctxt->progressive == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlGROW(ctxt);
    xVar15 = ctxt->instate;
  }
  if (xVar15 == XML_PARSER_EOF) {
    return (xmlChar *)0x0;
  }
  pxVar6 = ctxt->input;
  pbVar12 = pxVar6->end;
  lVar17 = (long)pxVar6->base - (long)pxVar7;
  lVar21 = 0;
  if (lVar17 != 0) {
    lVar21 = lVar17;
  }
  pbVar25 = pbVar25 + lVar21;
  pbVar23 = pbVar23 + lVar21;
  pbVar22 = pbVar22 + lVar21;
  if ((lVar27 < 0x989681) || ((ctxt->options & 0x80000) != 0)) goto LAB_0015a85b;
  goto LAB_0015aaab;
  while (pbVar4 = pbVar25 + -1, pbVar23 < pbVar25) {
LAB_0015a846:
    pbVar25 = pbVar4;
    if (pbVar25[-1] != 0x20) break;
  }
LAB_0015a85b:
  lVar27 = (long)pbVar22 - (long)pbVar23;
LAB_0015a861:
  if ((((pbVar22 < pbVar12) && (*pbVar22 != bVar1)) && (uVar5 = (uint)*pbVar22, uVar5 < 0x21)) &&
     ((0x100002600U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) goto code_r0x0015a88b;
  if ((10000000 < lVar27) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015aaab;
  bVar14 = *pbVar22;
  piVar24 = local_40;
joined_r0x0015aabc:
  local_40 = piVar24;
  if (bVar14 == bVar1) {
    if (piVar24 == (int *)0x0) {
      if (alloc != (int *)0x0) {
        *alloc = 1;
      }
      pbVar23 = xmlStrndup(pbVar23,(int)pbVar25 - (int)pbVar23);
      pxVar6 = ctxt->input;
    }
    else {
      *piVar24 = (int)pbVar25 - (int)pbVar23;
    }
    pxVar6->cur = pbVar22 + 1;
    pxVar6->line = iVar19;
    pxVar6->col = iVar26 + 1;
    if (alloc == (int *)0x0) {
      return pbVar23;
    }
    *alloc = 0;
    return pbVar23;
  }
  if (alloc != (int *)0x0) {
    *alloc = 1;
  }
  xVar18 = *pxVar6->cur;
  if (xVar18 != '\"') {
    if (xVar18 == '\'') {
      xVar18 = '\'';
      goto LAB_0015aaf2;
    }
    goto LAB_0015b1cb;
  }
LAB_0015aaf2:
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  xmlNextChar(ctxt);
  pbVar25 = (byte *)0x64;
  pxVar7 = (xmlChar *)(*xmlMallocAtomic)(100);
  local_58 = (byte *)0x0;
  if (pxVar7 == (xmlChar *)0x0) {
    pxVar7 = (xmlChar *)0x0;
    goto LAB_0015b235;
  }
  uVar5 = xmlCurrentChar(ctxt,&local_4c);
  bVar3 = false;
  uVar20 = 0;
  while( true ) {
    local_58 = (byte *)0x0;
    pxVar8 = ctxt->input->cur;
    if (xVar18 == *pxVar8) break;
    if (0xff < (int)uVar5) {
      if ((0xffefffff < uVar5 - 0x110000 || 0xffffe001 < uVar5 - 0xfffe) || uVar5 < 0xd800)
      goto LAB_0015abbb;
      break;
    }
    if ((int)uVar5 < 0x20) {
      if ((0xd < uVar5) || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0)) break;
    }
    else if (uVar5 == 0x3c) break;
LAB_0015abbb:
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015b2ca;
    if ((10000000 < uVar20) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015b31d;
    pxVar9 = pxVar7;
    if (0x26 < uVar5) {
LAB_0015acba:
      if (local_4c == 1) {
        pxVar7[uVar20] = (xmlChar)uVar5;
        uVar20 = uVar20 + 1;
      }
      else {
        iVar19 = xmlCopyCharMultiByte(pxVar7 + uVar20,uVar5);
        uVar20 = uVar20 + (long)iVar19;
      }
      if ((byte *)(uVar20 + 10) <= pbVar25) {
        bVar3 = false;
LAB_0015ae29:
        pxVar6 = ctxt->input;
        if (*pxVar6->cur == '\n') {
          pxVar6->line = pxVar6->line + 1;
          pxVar6->col = 1;
        }
        else {
          pxVar6->col = pxVar6->col + 1;
        }
        pxVar6->cur = pxVar6->cur + local_4c;
        pxVar7 = pxVar9;
        goto LAB_0015ae57;
      }
      pbVar22 = (byte *)((long)pbVar25 * 2 + 10);
      if (pbVar25 <= pbVar22) {
        pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar22);
        if (pxVar9 != (xmlChar *)0x0) {
          bVar3 = false;
          pbVar25 = pbVar22;
          goto LAB_0015ae29;
        }
LAB_0015b394:
        local_58 = (byte *)0x0;
      }
      goto LAB_0015b235;
    }
    if ((0x100002600U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
      if ((normalize == 0) || (uVar20 != 0)) {
        if (normalize == 0 || !bVar3) {
          if (local_4c == 1) {
            pxVar7[uVar20] = ' ';
            uVar20 = uVar20 + 1;
          }
          else {
            iVar19 = xmlCopyCharMultiByte(pxVar7 + uVar20,0x20);
            uVar20 = uVar20 + (long)iVar19;
          }
          while (pbVar25 < (byte *)(uVar20 + 10)) {
            pbVar22 = (byte *)((long)pbVar25 * 2 + 10);
            pxVar7 = pxVar9;
            if ((pbVar22 < pbVar25) ||
               (pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar9,(size_t)pbVar22), pbVar25 = pbVar22,
               pxVar9 == (xmlChar *)0x0)) goto LAB_0015b235;
          }
          bVar3 = true;
          piVar24 = local_40;
        }
        else {
          bVar3 = true;
        }
      }
      else {
        uVar20 = 0;
      }
      goto LAB_0015ae29;
    }
    if ((ulong)uVar5 != 0x26) goto LAB_0015acba;
    if (pxVar8[1] == '#') {
      iVar19 = xmlParseCharRef(ctxt);
      if (iVar19 == 0) {
        bVar3 = false;
        goto LAB_0015ae57;
      }
      pbVar22 = (byte *)(uVar20 + 10);
      if (iVar19 == 0x26) {
        if (ctxt->replaceEntities == 0) {
          pxVar8 = pxVar7;
          if (pbVar25 < pbVar22) {
            pbVar22 = (byte *)((long)pbVar25 * 2 + 10);
            if (pbVar22 < pbVar25) goto LAB_0015b235;
            pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar22);
            pbVar25 = pbVar22;
            if (pxVar8 == (xmlChar *)0x0) goto LAB_0015b394;
          }
          builtin_memcpy(pxVar8 + uVar20,"&#38;",5);
          uVar20 = uVar20 + 5;
          pxVar7 = pxVar8;
        }
        else {
          pxVar8 = pxVar7;
          if (pbVar25 < pbVar22) {
            pbVar22 = (byte *)((long)pbVar25 * 2 + 10);
            if (pbVar22 < pbVar25) goto LAB_0015b235;
            pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar22);
            pbVar25 = pbVar22;
            if (pxVar8 != (xmlChar *)0x0) goto LAB_0015b0e4;
            goto LAB_0015b394;
          }
LAB_0015b0e4:
          pxVar8[uVar20] = '&';
          uVar20 = uVar20 + 1;
          pxVar7 = pxVar8;
        }
      }
      else {
        pxVar8 = pxVar7;
        if (pbVar25 < pbVar22) {
          pbVar22 = (byte *)((long)pbVar25 * 2 + 10);
          if (pbVar22 < pbVar25) goto LAB_0015b235;
          pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar22);
          pbVar25 = pbVar22;
          if (pxVar8 == (xmlChar *)0x0) goto LAB_0015b394;
        }
        iVar19 = xmlCopyChar(0,pxVar8 + uVar20,iVar19);
        uVar20 = uVar20 + (long)iVar19;
        pxVar7 = pxVar8;
      }
    }
    else {
      pxVar10 = xmlParseEntityRef(ctxt);
      uVar11 = ctxt->nbentities + 1;
      ctxt->nbentities = uVar11;
      bVar3 = false;
      if (pxVar10 != (xmlEntityPtr)0x0) {
        ctxt->nbentities = uVar11 + (long)pxVar10->owner;
        if (pxVar10->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
          pxVar8 = pxVar7;
          if ((pbVar25 < (byte *)(uVar20 + 10)) &&
             ((pbVar22 = (byte *)((long)pbVar25 * 2 + 10), pbVar22 < pbVar25 ||
              (pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar22), pbVar25 = pbVar22,
              pxVar8 == (xmlChar *)0x0)))) goto LAB_0015b235;
          pxVar7 = pxVar8;
          if (*pxVar10->content == '&' && ctxt->replaceEntities == 0) {
            builtin_memcpy(pxVar8 + uVar20,"&#38;",5);
            uVar20 = uVar20 + 5;
          }
          else {
            pxVar8[uVar20] = *pxVar10->content;
            uVar20 = uVar20 + 1;
          }
        }
        else {
          if (ctxt->replaceEntities == 0) {
            iVar19 = xmlStrlen(pxVar10->name);
            pxVar8 = pxVar10->name;
            if (((pxVar10->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
                (pxVar9 = pxVar10->content, pxVar9 != (xmlChar *)0x0)) && (pxVar10->checked == 0)) {
              local_48 = (byte *)CONCAT44(local_48._4_4_,iVar19);
              local_38 = ctxt->nbentities;
              ctxt->depth = ctxt->depth + 1;
              pxVar9 = xmlStringDecodeEntities(ctxt,pxVar9,1,'\0','\0','\0');
              ctxt->depth = ctxt->depth + -1;
              uVar16 = (ctxt->nbentities - local_38) + 1;
              if (0x3ffffffe < uVar16) {
                uVar16 = 0x3fffffff;
              }
              pxVar10->checked = (int)uVar16 * 2;
              if (pxVar9 == (xmlChar *)0x0) {
                *pxVar10->content = '\0';
              }
              else {
                pxVar13 = xmlStrchr(pxVar9,'<');
                if (pxVar13 != (xmlChar *)0x0) {
                  *(byte *)&pxVar10->checked = (byte)pxVar10->checked | 1;
                }
                (*xmlFree)(pxVar9);
              }
              piVar24 = local_40;
              iVar19 = (int)local_48;
            }
            pxVar7[uVar20] = '&';
            local_48 = (byte *)((long)iVar19 + uVar20 + 0xb);
            pxVar9 = pxVar7;
            do {
              pxVar7 = pxVar9;
              local_58 = (byte *)0x0;
              if (local_48 <= pbVar25) {
                uVar20 = uVar20 + 2;
                for (; 0 < iVar19; iVar19 = iVar19 + -1) {
                  xVar2 = *pxVar8;
                  pxVar8 = pxVar8 + 1;
                  pxVar7[uVar20 - 1] = xVar2;
                  uVar20 = uVar20 + 1;
                }
                pxVar7[uVar20 - 1] = ';';
                goto LAB_0015ae57;
              }
              pbVar22 = (byte *)((long)iVar19 + 10 + (long)pbVar25 * 2);
            } while ((pbVar25 <= pbVar22) &&
                    (pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar22), piVar24 = local_40,
                    pbVar25 = pbVar22, pxVar9 != (xmlChar *)0x0));
            goto LAB_0015b235;
          }
          ctxt->depth = ctxt->depth + 1;
          pbVar12 = xmlStringDecodeEntities(ctxt,pxVar10->content,1,'\0','\0','\0');
          ctxt->depth = ctxt->depth + -1;
          pbVar22 = pbVar12;
          if (pbVar12 != (byte *)0x0) {
            while( true ) {
              pxVar8 = pxVar7;
              local_48 = pbVar22;
              bVar1 = *pbVar12;
              bVar14 = 0x20;
              pxVar7 = pxVar8;
              if (((1 < bVar1 - 9) && (bVar1 != 0xd)) && (bVar14 = bVar1, bVar1 == 0)) break;
              pxVar8[uVar20] = bVar14;
              uVar16 = uVar20 + 1;
              pbVar12 = pbVar12 + 1;
              pbVar23 = (byte *)(uVar20 + 0xb);
              uVar20 = uVar16;
              pbVar22 = local_48;
              if ((pbVar25 < pbVar23) &&
                 ((pbVar23 = (byte *)((long)pbVar25 * 2 + 10), pbVar23 < pbVar25 ||
                  (pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar8,(size_t)pbVar23), pbVar22 = local_48,
                  pbVar25 = pbVar23, piVar24 = local_40, pxVar7 == (xmlChar *)0x0)))) {
                local_58 = local_48;
                pxVar7 = pxVar8;
                goto LAB_0015b235;
              }
            }
            (*xmlFree)(local_48);
          }
        }
      }
    }
    bVar3 = false;
LAB_0015ae57:
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    uVar5 = xmlCurrentChar(ctxt,&local_4c);
  }
  if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015b2ca:
    local_58 = (byte *)0x0;
    goto LAB_0015b246;
  }
  if (((normalize != 0) && (bVar3)) && (uVar20 != 0)) {
    do {
      if (pxVar7[uVar20 - 1] != ' ') goto LAB_0015b2a7;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
    uVar20 = 0;
  }
LAB_0015b2a7:
  pxVar7[uVar20] = '\0';
  xVar2 = *ctxt->input->cur;
  if (xVar2 == '<') {
    xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
  }
  else if (xVar18 == xVar2) {
    xmlNextChar(ctxt);
  }
  else {
    if (uVar5 == 0) {
LAB_0015b302:
      msg = "AttValue: \' expected\n";
      error = XML_ERR_ATTRIBUTE_NOT_FINISHED;
    }
    else {
      if ((int)uVar5 < 0x100) {
        if ((0x1f < (int)uVar5) || ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0))))
        goto LAB_0015b302;
      }
      else if (uVar5 - 0x10000 < 0x100000 || (uVar5 - 0xe000 < 0x1ffe || uVar5 < 0xd800))
      goto LAB_0015b302;
      msg = "invalid character in attribute value\n";
      error = XML_ERR_INVALID_CHAR;
    }
    xmlFatalErrMsg(ctxt,error,msg);
  }
  if (uVar20 < 0x7fffffff) {
    if (piVar24 == (int *)0x0) {
      return pxVar7;
    }
    *piVar24 = (int)uVar20;
    return pxVar7;
  }
LAB_0015b31d:
  xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
  local_58 = (byte *)0x0;
LAB_0015b235:
  xmlErrMemory(ctxt,(char *)0x0);
LAB_0015b246:
  if (pxVar7 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar7);
  }
  if (local_58 != (byte *)0x0) {
    (*xmlFree)(local_58);
    return (xmlChar *)0x0;
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    if (alloc) *alloc = 0;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}